

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merlin.cpp
# Opt level: O1

int __thiscall Merlin::init(Merlin *this,EVP_PKEY_CTX *ctx)

{
  pointer pcVar1;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  timeval tv;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  timeval local_30;
  
  gettimeofday(&local_30,(__timezone_ptr_t)0x0);
  dVar5 = (double)local_30.tv_sec;
  dVar6 = (double)local_30.tv_usec;
  if (this->m_useFiles == true) {
    bVar3 = read_model(this,(this->m_modelFile)._M_dataplus._M_p);
    if ((((bVar3) &&
         (((this->m_evidenceFile)._M_string_length == 0 ||
          (bVar3 = read_evidence(this,(this->m_evidenceFile)._M_dataplus._M_p), bVar3)))) &&
        (((this->m_virtualEvidenceFile)._M_string_length == 0 ||
         (bVar3 = read_virtual_evidence(this,(this->m_virtualEvidenceFile)._M_dataplus._M_p), bVar3)
         ))) && ((((this->m_queryFile)._M_string_length == 0 ||
                  (bVar3 = read_query(this,(this->m_queryFile)._M_dataplus._M_p), bVar3)) &&
                 (((this->m_datasetFile)._M_string_length == 0 ||
                  (bVar3 = read_dataset(this,(this->m_datasetFile)._M_dataplus._M_p), bVar3)))))) {
LAB_0015caf6:
      iVar4 = gettimeofday(&local_30,(__timezone_ptr_t)0x0);
      this->m_ioTime =
           ((double)local_30.tv_usec / 1000000.0 + (double)local_30.tv_sec) -
           (dVar6 / 1000000.0 + dVar5);
      return (int)CONCAT71((uint7)(uint3)((uint)iVar4 >> 8),1);
    }
  }
  else {
    pcVar1 = (this->m_modelString)._M_dataplus._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar1,pcVar1 + (this->m_modelString)._M_string_length);
    bVar3 = read_model(this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (bVar3) {
      if ((this->m_evidenceString)._M_string_length == 0) {
        pcVar1 = (this->m_evidenceString)._M_dataplus._M_p;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_70,pcVar1,pcVar1);
        bVar3 = read_evidence(this,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if (!bVar3) {
          return 0;
        }
      }
      if ((this->m_virtualEvidenceString)._M_string_length == 0) {
        pcVar1 = (this->m_virtualEvidenceString)._M_dataplus._M_p;
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_90,pcVar1,pcVar1);
        bVar3 = read_virtual_evidence(this,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        if (!bVar3) {
          return 0;
        }
      }
      sVar2 = (this->m_queryString)._M_string_length;
      if (sVar2 != 0) {
        pcVar1 = (this->m_queryString)._M_dataplus._M_p;
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_b0,pcVar1,pcVar1 + sVar2);
        bVar3 = read_query(this,&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        if (!bVar3) {
          return 0;
        }
      }
      sVar2 = (this->m_datasetString)._M_string_length;
      if (sVar2 != 0) {
        pcVar1 = (this->m_datasetString)._M_dataplus._M_p;
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_d0,pcVar1,pcVar1 + sVar2);
        bVar3 = read_dataset(this,&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        if (!bVar3) {
          return 0;
        }
      }
      goto LAB_0015caf6;
    }
  }
  return 0;
}

Assistant:

bool Merlin::init() {

	double timestamp = merlin::timeSystem();
	if (m_useFiles) { // input files
		if (!read_model(m_modelFile.c_str())) {
			return false;
		}
		if (m_evidenceFile.empty() == false) {
			if (!read_evidence(m_evidenceFile.c_str())) {
				return false;
			}
		}
		if (m_virtualEvidenceFile.empty() == false) {
			if (!read_virtual_evidence(m_virtualEvidenceFile.c_str())) {
				return false;
			}
		}
		if (m_queryFile.empty() == false) {
			if (!read_query(m_queryFile.c_str())) {
				return false;
			}
		}
		if (m_datasetFile.empty() == false) {
			if (!read_dataset(m_datasetFile.c_str())) {
				return false;
			}
		}
	} else { // input strings
		if (!read_model(m_modelString)) {
			return false;
		}
		if (m_evidenceString.empty()) {
			if (!read_evidence(m_evidenceString)) {
				return false;
			}
		}
		if (m_virtualEvidenceString.empty()) {
			if (!read_virtual_evidence(m_virtualEvidenceString)) {
				return false;
			}
		}
		if (!m_queryString.empty()) {
			if (!read_query(m_queryString)) {
				return false;
			}
		}
		if (!m_datasetString.empty()) {
			if (!read_dataset(m_datasetString)) {
				return false;
			}
		}
	}

	m_ioTime = (merlin::timeSystem() - timestamp);
	return true;
}